

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int consider_move_vars_only(gen_ctx_t gen_ctx)

{
  bool local_11;
  gen_ctx_t gen_ctx_local;
  
  VARR_inttrunc(gen_ctx->lr_ctx->var_to_scan_var_map,0);
  VARR_MIR_reg_ttrunc(gen_ctx->lr_ctx->scan_var_to_var_map,0);
  bitmap_clear(gen_ctx->temp_bitmap);
  gen_ctx->lr_ctx->scan_vars_num = 0;
  scan_collected_moves(gen_ctx);
  local_11 = false;
  if (0 < gen_ctx->lr_ctx->scan_vars_num) {
    local_11 = gen_ctx->lr_ctx->scan_vars_num < 10000;
  }
  return (int)local_11;
}

Assistant:

static int consider_move_vars_only (gen_ctx_t gen_ctx) {
  VARR_TRUNC (int, var_to_scan_var_map, 0);
  VARR_TRUNC (MIR_reg_t, scan_var_to_var_map, 0);
  bitmap_clear (temp_bitmap);
  scan_vars_num = 0;
  scan_collected_moves (gen_ctx);
  return scan_vars_num > 0 && scan_vars_num < MIR_MAX_COALESCE_VARS;
}